

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadBootStrap(CrateReader *this)

{
  long lVar1;
  bool bVar2;
  ssize_t sVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  uchar *in_R9;
  uint8_t version [8];
  uint8_t magic [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ostringstream ss_e;
  string local_70;
  string local_50;
  
  sVar3 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)magic);
  if (sVar3 == 8) {
    if (magic == (uint8_t  [8])0x434453552d525850) {
      sVar3 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)version);
      if (sVar3 != 8) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
        poVar4 = ::std::operator<<(poVar4,"():");
        iVar5 = 0x1842;
        goto LAB_00188f69;
      }
      this->_version[0] = version[0];
      this->_version[1] = version[1];
      this->_version[2] = version[2];
      if (version[1] < 4 && version[0] == '\0') {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1851);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::to_string(&local_228,(uint)version[0]);
        ::std::operator+(&local_268,"Version must be 0.4.0 or later, but got ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_228);
        ::std::operator+(&local_208,&local_268,".");
        ::std::__cxx11::to_string(&local_50,(uint)version[1]);
        ::std::operator+(&local_288,&local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
        ::std::operator+(&local_248,&local_288,".");
        ::std::__cxx11::to_string(&local_70,(uint)version[2]);
        ::std::operator+(&local_2a8,&local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_70);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2a8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
LAB_001891b9:
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00188fcd;
      }
      if (version[0] != '\0' || 9 < version[1]) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[Crate]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x185a);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_248,
                   "Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0",
                   (allocator *)&local_288);
        fmt::format<unsigned_char,unsigned_char,unsigned_char>
                  ((string *)&local_2a8,(fmt *)&local_248,(string *)this,this->_version + 1,
                   this->_version + 2,in_R9);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2a8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00188efc;
      }
      this->_toc_offset = 0;
      bVar2 = StreamReader::read8(this->_sr,&this->_toc_offset);
      if (bVar2) {
        lVar1 = this->_toc_offset;
        if ((0x58 < lVar1) && (lVar1 < (long)this->_sr->length_)) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1865);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::to_string((string *)&local_268,this->_toc_offset);
        ::std::operator+(&local_208,"Invalid TOC offset value: ",&local_268);
        ::std::operator+(&local_288,&local_208,", filesize = ");
        std::__cxx11::to_string((string *)&local_228,this->_sr->length_);
        ::std::operator+(&local_248,&local_288,(string *)&local_228);
        ::std::operator+(&local_2a8,&local_248,".");
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2a8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        goto LAB_001891b9;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x185f);
      ::std::operator<<(poVar4," ");
      pcVar6 = "Failed to read TOC offset.";
      goto LAB_00188f84;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x183b);
    ::std::operator<<(poVar4," ");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    ::std::__cxx11::string::_M_construct<unsigned_char*>((string *)&local_288,magic,&local_2a8);
    ::std::operator+(&local_248,"Invalid magic number. Expected \'PXR-USDC\' but got \'",&local_288)
    ;
    ::std::operator+(&local_2a8,&local_248,"\'");
    poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2a8);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
LAB_00188efc:
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
    poVar4 = ::std::operator<<(poVar4,"():");
    iVar5 = 0x1835;
LAB_00188f69:
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar5);
    ::std::operator<<(poVar4," ");
    pcVar6 = "Failed to read magic number.";
LAB_00188f84:
    poVar4 = ::std::operator<<((ostream *)&ss_e,pcVar6);
    ::std::operator<<(poVar4,"\n");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_00188fcd:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool CrateReader::ReadBootStrap() {
  // parse header.
  uint8_t magic[8];
  if (8 != _sr->read(/* req */ 8, /* dst len */ 8, magic)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  if (memcmp(magic, "PXR-USDC", 8)) {
    PUSH_ERROR("Invalid magic number. Expected 'PXR-USDC' but got '" +
               std::string(magic, magic + 8) + "'");
    return false;
  }

  // parse version(first 3 bytes from 8 bytes)
  uint8_t version[8];
  if (8 != _sr->read(8, 8, version)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  DCOUT("version = " << int(version[0]) << "." << int(version[1]) << "."
                     << int(version[2]));

  _version[0] = version[0];
  _version[1] = version[1];
  _version[2] = version[2];

  // We only support version 0.4.0 or later.
  if ((version[0] == 0) && (version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(version[0]) + "." + std::to_string(version[1]) +
               "." + std::to_string(version[2]));
    return false;
  }

  // Currently up to 0.9.0
  if ((version[0] == 0) && (version[1] < 10)) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0",
      _version[0], _version[1], _version[2]));
  }

  _toc_offset = 0;
  if (!_sr->read8(&_toc_offset)) {
    PUSH_ERROR("Failed to read TOC offset.");
    return false;
  }

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid TOC offset value: " + std::to_string(_toc_offset) +
               ", filesize = " + std::to_string(_sr->size()) + ".");
    return false;
  }

  DCOUT("toc offset = " << _toc_offset);

  return true;
}